

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void test_ranges_impl<trng::mrg5,float>(void)

{
  ExprLhs<bool> EVar1;
  ExprLhs<bool> EVar2;
  ExprLhs<bool> EVar3;
  ExprLhs<bool> EVar4;
  StringRef SVar5;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  float x_max;
  float x_min;
  generator_max<trng::mrg5> r_max;
  generator_min<trng::mrg5> r_min;
  undefined4 in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffddc;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  undefined1 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde1;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffde2;
  undefined1 in_stack_fffffffffffffde3;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde5;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  StringRef *in_stack_fffffffffffffde8;
  AssertionHandler *in_stack_fffffffffffffdf0;
  SourceLineInfo in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffe08 [16];
  SourceLineInfo local_188;
  StringRef local_178;
  undefined1 local_119;
  SourceLineInfo local_108;
  StringRef local_f8;
  undefined1 local_89;
  SourceLineInfo local_78;
  StringRef local_68;
  float local_c;
  float local_8;
  
  local_8 = 0.0;
  local_c = 0.0;
  local_8 = trng::utility::u01xx_traits<float,_1UL,_generator_min<trng::mrg5>_>::cc
                      ((generator_min<trng::mrg5> *)in_stack_fffffffffffffdf0);
  local_c = trng::utility::u01xx_traits<float,_1UL,_generator_max<trng::mrg5>_>::cc
                      ((generator_max<trng::mrg5> *)in_stack_fffffffffffffdf0);
  local_68 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffde7,
                                         CONCAT16(in_stack_fffffffffffffde6,
                                                  CONCAT15(in_stack_fffffffffffffde5,
                                                           CONCAT14(in_stack_fffffffffffffde4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                        ,CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,
                                           CONCAT24(in_stack_fffffffffffffddc,
                                                    in_stack_fffffffffffffdd8))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x88);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(in_stack_fffffffffffffde5,
                                        CONCAT14(in_stack_fffffffffffffde4,
                                                 CONCAT13(in_stack_fffffffffffffde3,
                                                          CONCAT12(in_stack_fffffffffffffde2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
             (StringRef)in_stack_fffffffffffffdf8,
             CONCAT13(in_stack_fffffffffffffddf,
                      CONCAT12(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc)));
  uVar8 = 0.0 <= local_8 && local_c <= 1.0;
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)
                     CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )),false);
  local_89 = EVar1;
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffe08._8_8_,in_stack_fffffffffffffe08._0_8_);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(in_stack_fffffffffffffde3,
                                                                CONCAT12(in_stack_fffffffffffffde2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(in_stack_fffffffffffffde3,
                                                                CONCAT12(in_stack_fffffffffffffde2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))));
  local_8 = trng::utility::u01xx_traits<float,_1UL,_generator_min<trng::mrg5>_>::co
                      ((generator_min<trng::mrg5> *)
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                 CONCAT13(in_stack_fffffffffffffde3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))));
  local_c = trng::utility::u01xx_traits<float,_1UL,_generator_max<trng::mrg5>_>::co
                      ((generator_max<trng::mrg5> *)
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                 CONCAT13(in_stack_fffffffffffffde3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))));
  local_f8 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffde7,
                                         CONCAT16(in_stack_fffffffffffffde6,
                                                  CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                        ,CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,
                                           CONCAT24(in_stack_fffffffffffffddc,
                                                    in_stack_fffffffffffffdd8))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x8b);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(in_stack_fffffffffffffde3,
                                                                CONCAT12(in_stack_fffffffffffffde2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
             (StringRef)in_stack_fffffffffffffdf8,
             CONCAT13(in_stack_fffffffffffffddf,
                      CONCAT12(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc)));
  uVar7 = 0.0 <= local_8 && local_c < 1.0;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)
                     CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )),false);
  local_119 = EVar2;
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffe08._8_8_,in_stack_fffffffffffffe08._0_8_);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))));
  local_8 = trng::utility::u01xx_traits<float,_1UL,_generator_min<trng::mrg5>_>::oc
                      ((generator_min<trng::mrg5> *)0x2a8a5b);
  local_c = trng::utility::u01xx_traits<float,_1UL,_generator_max<trng::mrg5>_>::oc
                      ((generator_max<trng::mrg5> *)0x2a8a71);
  local_178 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffde7,
                                          CONCAT16(in_stack_fffffffffffffde6,
                                                   CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                           CONCAT13(uVar7,CONCAT12(
                                                  EVar2.m_lhs,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
                         CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,
                                           CONCAT24(in_stack_fffffffffffffddc,
                                                    in_stack_fffffffffffffdd8))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x8e);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
             (StringRef)in_stack_fffffffffffffdf8,
             CONCAT13(in_stack_fffffffffffffddf,
                      CONCAT12(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc)));
  uVar6 = 0.0 < local_8 && local_c <= 1.0;
  EVar3 = Catch::Decomposer::operator<=
                    ((Decomposer *)
                     CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )),false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffe08._8_8_,in_stack_fffffffffffffe08._0_8_);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(uVar6,EVar3.
                                                  m_lhs))))))));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(uVar6,EVar3.
                                                  m_lhs))))))));
  local_8 = trng::utility::u01xx_traits<float,_1UL,_generator_min<trng::mrg5>_>::oo
                      ((generator_min<trng::mrg5> *)
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                 CONCAT13(uVar7,CONCAT12(EVar2.m_lhs
                                                                                         ,CONCAT11(
                                                  uVar6,EVar3.m_lhs))))))));
  local_c = trng::utility::u01xx_traits<float,_1UL,_generator_max<trng::mrg5>_>::oo
                      ((generator_max<trng::mrg5> *)
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                 CONCAT13(uVar7,CONCAT12(EVar2.m_lhs
                                                                                         ,CONCAT11(
                                                  uVar6,EVar3.m_lhs))))))));
  SVar5 = operator____catch_sr
                    ((char *)CONCAT17(in_stack_fffffffffffffde7,
                                      CONCAT16(in_stack_fffffffffffffde6,
                                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                                       CONCAT13(uVar7,CONCAT12(EVar2
                                                  .m_lhs,CONCAT11(uVar6,EVar3.m_lhs))))))),
                     CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )));
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&stack0xfffffffffffffdf8,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x91);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffde7,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(uVar6,EVar3.
                                                  m_lhs))))))),(StringRef)in_stack_fffffffffffffdf8,
             CONCAT13(in_stack_fffffffffffffddf,
                      CONCAT12(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc)));
  EVar4 = Catch::Decomposer::operator<=
                    ((Decomposer *)
                     CONCAT17(0.0 < local_8 && local_c < 1.0,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )),false);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)SVar5.m_size,(ExprLhs<bool> *)SVar5.m_start);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(EVar4.m_lhs,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(uVar6,EVar3.
                                                  m_lhs))))))));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(EVar4.m_lhs,
                      CONCAT16(in_stack_fffffffffffffde6,
                               CONCAT15(uVar8,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar7,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(uVar6,EVar3.
                                                  m_lhs))))))));
  return;
}

Assistant:

void test_ranges_impl() {
  generator_min<R> r_min;
  generator_max<R> r_max;
  using u01xx_min = trng::utility::u01xx_traits<T, 1, generator_min<R>>;
  using u01xx_max = trng::utility::u01xx_traits<T, 1, generator_max<R>>;
  T x_min{}, x_max{};
  x_min = u01xx_min::cc(r_min);
  x_max = u01xx_max::cc(r_max);
  REQUIRE((x_min >= 0 and x_max <= 1));
  x_min = u01xx_min::co(r_min);
  x_max = u01xx_max::co(r_max);
  REQUIRE((x_min >= 0 and x_max < 1));
  x_min = u01xx_min::oc(r_min);
  x_max = u01xx_max::oc(r_max);
  REQUIRE((x_min > 0 and x_max <= 1));
  x_min = u01xx_min::oo(r_min);
  x_max = u01xx_max::oo(r_max);
  REQUIRE((x_min > 0 and x_max < 1));
}